

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall
cfdcapi_psbt_ExtractPsbtTransaction_Test::TestBody(cfdcapi_psbt_ExtractPsbtTransaction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  char *exp_tx;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  uint32_t in_stack_000002c8;
  uint32_t in_stack_000002cc;
  char *in_stack_000002d0;
  char *in_stack_000002d8;
  int in_stack_000002e4;
  void *in_stack_000002e8;
  void **in_stack_00000300;
  bool *in_stack_fffffffffffffdd8;
  AssertionResult *in_stack_fffffffffffffde0;
  CfdErrorCode *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  AssertHelper local_178;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  AssertHelper local_e0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar3;
  void *in_stack_ffffffffffffff38;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x386d5a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x19a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x386dbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x386e12);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(type *)0x386e46);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x19b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x386f42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x386fbd);
  local_14 = CfdCreatePsbtHandle(in_stack_000002e8,in_stack_000002e4,in_stack_000002d8,
                                 in_stack_000002d0,in_stack_000002cc,in_stack_000002c8,
                                 in_stack_00000300);
  uVar3 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff38);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3870d3);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x1a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&stack0xffffffffffffff28);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x387130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x387188);
  if (local_14 == 0) {
    local_14 = CfdExtractPsbtTransaction
                         (in_stack_ffffffffffffff38,
                          (void *)CONCAT44(uVar3,in_stack_ffffffffffffff30),
                          (char **)in_stack_ffffffffffffff28.ptr_);
    local_f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x38725b);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x1a6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x3872b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38730d);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_118,"exp_tx","output",
                 "02000000000102267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000017160014962c4e08f336d3afbc3415c9d359ae1040470520ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc0000000006a473044022066ec956e96783cd6122c9c07732a3ae9931b69abdaff1f362c28ed5fa96728d302206a16d4ae46fed48d3d0492737613bd9b51fe3e2453b4446e447c65bf2c967e10012102d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555024730440220299862a67a9b454d6cda5fee34a52d9089bfa024444d88031c34a98e298bdbca02204b47fcf507b80954108e0375673fdbdd084c5fbb994f6c951720f2eb2f6bb866012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe0000000000"
                 ,(char *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3873b1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x1a8,pcVar2);
        testing::internal::AssertHelper::operator=(&local_128,&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        testing::Message::~Message((Message *)0x38740e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x387463);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffde8);
    }
    local_14 = CfdFreePsbtHandle((void *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98),
                                 in_stack_fffffffffffffe90.ptr_);
    local_13c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x38753b);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x1ae,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x387598);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3875ed);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffde8);
  this_00 = &local_160;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             &this_00->success_,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3876a4);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x1b2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&stack0xfffffffffffffe90);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x387701);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x387756);
  return;
}

Assistant:

TEST(cfdcapi_psbt, ExtractPsbtTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_tx = "02000000000102267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000017160014962c4e08f336d3afbc3415c9d359ae1040470520ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc0000000006a473044022066ec956e96783cd6122c9c07732a3ae9931b69abdaff1f362c28ed5fa96728d302206a16d4ae46fed48d3d0492737613bd9b51fe3e2453b4446e447c65bf2c967e10012102d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555024730440220299862a67a9b454d6cda5fee34a52d9089bfa024444d88031c34a98e298bdbca02204b47fcf507b80954108e0375673fdbdd084c5fbb994f6c951720f2eb2f6bb866012102565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe0000000000";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHAQcXFgAUlixOCPM206+8NBXJ01muEEBHBSABCGsCRzBEAiApmGKmeptFTWzaX+40pS2Qib+gJERNiAMcNKmOKYvbygIgS0f89Qe4CVQQjgN1Zz/b3QhMX7uZT2yVFyDy6y9ruGYBIQJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/gABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAAAEHakcwRAIgZuyVbpZ4PNYSLJwHcyo66ZMbaava/x82LCjtX6lnKNMCIGoW1K5G/tSNPQSSc3YTvZtR/j4kU7REbkR8Zb8sln4QASEC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdExtractPsbtTransaction(handle, psbt_handle, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_tx, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}